

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

int uECC_sign_deterministic
              (uint8_t *private_key,uint8_t *message_hash,uint hash_size,
              uECC_HashContext *hash_context,uint8_t *signature,uECC_Curve curve)

{
  uint8_t *result;
  short sVar1;
  uint uVar2;
  uint8_t *K;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  char cVar10;
  bool bVar11;
  uECC_word_t T [4];
  uint8_t auStack_d8 [128];
  uECC_word_t local_58 [5];
  
  K = hash_context->tmp;
  sVar1 = curve->num_n_bits;
  iVar7 = (int)sVar1;
  iVar4 = iVar7 + 0x7e;
  if (-1 < iVar7 + 0x3f) {
    iVar4 = iVar7 + 0x3f;
  }
  result = K + hash_context->result_size;
  cVar10 = curve->num_bytes;
  if ((ulong)hash_context->result_size != 0) {
    uVar5 = 0;
    do {
      result[uVar5] = '\x01';
      K[uVar5] = '\0';
      uVar5 = uVar5 + 1;
    } while (uVar5 < hash_context->result_size);
  }
  HMAC_init(hash_context,K);
  result[hash_context->result_size] = '\0';
  (*hash_context->update_hash)(hash_context,result,hash_context->result_size + 1);
  (*hash_context->update_hash)(hash_context,private_key,(int)cVar10);
  (*hash_context->update_hash)(hash_context,message_hash,hash_size);
  HMAC_finish(hash_context,K,K);
  HMAC_init(hash_context,K);
  (*hash_context->update_hash)(hash_context,result,hash_context->result_size);
  HMAC_finish(hash_context,K,result);
  HMAC_init(hash_context,K);
  result[hash_context->result_size] = '\x01';
  (*hash_context->update_hash)(hash_context,result,hash_context->result_size + 1);
  (*hash_context->update_hash)(hash_context,private_key,(int)cVar10);
  (*hash_context->update_hash)(hash_context,message_hash,hash_size);
  HMAC_finish(hash_context,K,K);
  HMAC_init(hash_context,K);
  (*hash_context->update_hash)(hash_context,result,hash_context->result_size);
  HMAC_finish(hash_context,K,result);
  iVar6 = (iVar4 >> 6) << 0x18;
  lVar8 = 0;
LAB_00108d71:
  cVar10 = '\0';
  do {
    do {
      HMAC_init(hash_context,K);
      (*hash_context->update_hash)(hash_context,result,hash_context->result_size);
      HMAC_finish(hash_context,K,result);
      uVar2 = hash_context->result_size;
    } while ((ulong)uVar2 == 0);
    uVar5 = 1;
    do {
      lVar9 = (long)cVar10;
      cVar10 = cVar10 + '\x01';
      *(uint8_t *)((long)local_58 + lVar9) = result[uVar5 - 1];
      if (iVar6 >> 0x15 <= (int)cVar10) {
        if (iVar7 < iVar6 >> 0x12) {
          local_58[(char)(iVar4 >> 6) + -1] =
               local_58[(char)(iVar4 >> 6) + -1] & 0xffffffffffffffffU >> (-(char)sVar1 & 0x3fU);
        }
        iVar3 = uECC_sign_with_k(private_key,message_hash,hash_size,local_58,signature,curve);
        if (iVar3 == 0) {
          HMAC_init(hash_context,K);
          result[hash_context->result_size] = '\0';
          (*hash_context->update_hash)(hash_context,result,hash_context->result_size + 1);
          HMAC_finish(hash_context,K,K);
          HMAC_init(hash_context,K);
          (*hash_context->update_hash)(hash_context,result,hash_context->result_size);
          HMAC_finish(hash_context,K,result);
          lVar8 = lVar8 + 1;
          if (lVar8 != 0x40) goto LAB_00108d71;
          iVar4 = 0;
        }
        else {
          iVar4 = 1;
        }
        return iVar4;
      }
      bVar11 = uVar5 != uVar2;
      uVar5 = uVar5 + 1;
    } while (bVar11);
  } while( true );
}

Assistant:

int uECC_sign_deterministic(const uint8_t *private_key,
                            const uint8_t *message_hash,
                            unsigned hash_size,
                            const uECC_HashContext *hash_context,
                            uint8_t *signature,
                            uECC_Curve curve) {
    uint8_t *K = hash_context->tmp;
    uint8_t *V = K + hash_context->result_size;
    wordcount_t num_bytes = curve->num_bytes;
    wordcount_t num_n_words = BITS_TO_WORDS(curve->num_n_bits);
    bitcount_t num_n_bits = curve->num_n_bits;
    uECC_word_t tries;
    unsigned i;
    for (i = 0; i < hash_context->result_size; ++i) {
        V[i] = 0x01;
        K[i] = 0;
    }

    /* K = HMAC_K(V || 0x00 || int2octets(x) || h(m)) */
    HMAC_init(hash_context, K);
    V[hash_context->result_size] = 0x00;
    HMAC_update(hash_context, V, hash_context->result_size + 1);
    HMAC_update(hash_context, private_key, num_bytes);
    HMAC_update(hash_context, message_hash, hash_size);
    HMAC_finish(hash_context, K, K);

    update_V(hash_context, K, V);

    /* K = HMAC_K(V || 0x01 || int2octets(x) || h(m)) */
    HMAC_init(hash_context, K);
    V[hash_context->result_size] = 0x01;
    HMAC_update(hash_context, V, hash_context->result_size + 1);
    HMAC_update(hash_context, private_key, num_bytes);
    HMAC_update(hash_context, message_hash, hash_size);
    HMAC_finish(hash_context, K, K);

    update_V(hash_context, K, V);

    for (tries = 0; tries < uECC_RNG_MAX_TRIES; ++tries) {
        uECC_word_t T[uECC_MAX_WORDS];
        uint8_t *T_ptr = (uint8_t *)T;
        wordcount_t T_bytes = 0;
        for (;;) {
            update_V(hash_context, K, V);
            for (i = 0; i < hash_context->result_size; ++i) {
                T_ptr[T_bytes++] = V[i];
                if (T_bytes >= num_n_words * uECC_WORD_SIZE) {
                    goto filled;
                }
            }
        }
    filled:
        if ((bitcount_t)num_n_words * uECC_WORD_SIZE * 8 > num_n_bits) {
            uECC_word_t mask = (uECC_word_t)-1;
            T[num_n_words - 1] &=
                mask >> ((bitcount_t)(num_n_words * uECC_WORD_SIZE * 8 - num_n_bits));
        }

        if (uECC_sign_with_k(private_key, message_hash, hash_size, T, signature, curve)) {
            return 1;
        }

        /* K = HMAC_K(V || 0x00) */
        HMAC_init(hash_context, K);
        V[hash_context->result_size] = 0x00;
        HMAC_update(hash_context, V, hash_context->result_size + 1);
        HMAC_finish(hash_context, K, K);

        update_V(hash_context, K, V);
    }
    return 0;
}